

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void flatcc_json_printer_char_array_struct_field
               (flatcc_json_printer_t *ctx,int index,void *p,size_t offset,char *name,size_t len,
               size_t count)

{
  byte *pbVar1;
  char *pcVar2;
  byte c;
  long lVar3;
  size_t sVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *s;
  
  if (index != 0) {
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = ',';
  }
  pbVar5 = (byte *)((long)p + offset);
  print_name(ctx,name,len);
  do {
    sVar4 = count;
    if (sVar4 == 0) break;
    count = sVar4 - 1;
  } while (pbVar5[sVar4 - 1] == 0);
  pcVar2 = ctx->p;
  ctx->p = pcVar2 + 1;
  *pcVar2 = '\"';
  c = 0;
  s = pbVar5;
  while( true ) {
    pbVar1 = pbVar5 + sVar4;
    lVar3 = -sVar4;
    for (; (((lVar3 = lVar3 + 1, pbVar6 = pbVar1, lVar3 != 1 &&
             (c = *pbVar5, pbVar6 = pbVar5, 0x1f < c)) && (c != 0x22)) && (c != 0x5c));
        pbVar5 = pbVar5 + 1) {
    }
    print(ctx,(char *)s,(long)pbVar6 - (long)s);
    if (lVar3 == 1) break;
    print_escape(ctx,c);
    pbVar5 = pbVar6 + 1;
    sVar4 = -lVar3;
    s = s + ((long)pbVar6 - (long)s) + 1;
  }
  pcVar2 = ctx->p;
  ctx->p = pcVar2 + 1;
  *pcVar2 = '\"';
  return;
}

Assistant:

void flatcc_json_printer_char_array_struct_field(
        flatcc_json_printer_t *ctx,
        int index, const void *p, size_t offset,
        const char *name, size_t len, size_t count)
{
    p = (void *)((size_t)p + offset);
    if (index) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_char_array(ctx, p, count);
}